

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

uint64_t sx_tm_since(uint64_t start_ticks)

{
  uint64_t uVar1;
  uint64_t start_ticks_local;
  
  uVar1 = stm_since(start_ticks);
  return uVar1;
}

Assistant:

uint64_t sx_tm_since(uint64_t start_ticks)
{
    return stm_since(start_ticks);
}